

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

bool __thiscall wasm::Literal::operator==(Literal *this,Literal *other)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  bool bVar7;
  BasicType BVar8;
  element_type *peVar9;
  element_type *peVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  bool local_41;
  BasicHeapType local_2c;
  HeapType local_28;
  Literal *local_20;
  Literal *other_local;
  Literal *this_local;
  
  local_20 = other;
  other_local = this;
  bVar7 = wasm::Type::operator!=(&this->type,&other->type);
  if (bVar7) {
    this_local._7_1_ = false;
  }
  else {
    bVar7 = wasm::Type::isBasic(&this->type);
    if (bVar7) {
      BVar8 = wasm::Type::getBasic(&this->type);
      switch(BVar8) {
      case none:
        this_local._7_1_ = true;
        break;
      case unreachable:
      default:
switchD_01b8c3cc_default:
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                           ,0x1bf);
      case i32:
      case f32:
        this_local._7_1_ = (this->field_0).i32 == (local_20->field_0).i32;
        break;
      case i64:
      case f64:
        this_local._7_1_ = (this->field_0).i64 == (local_20->field_0).i64;
        break;
      case v128:
        cVar11 = -((this->field_0).v128[0] == (local_20->field_0).v128[0]);
        cVar12 = -((this->field_0).v128[1] == (local_20->field_0).v128[1]);
        cVar13 = -((this->field_0).v128[2] == (local_20->field_0).v128[2]);
        cVar14 = -((this->field_0).v128[3] == (local_20->field_0).v128[3]);
        cVar15 = -((this->field_0).v128[4] == (local_20->field_0).v128[4]);
        cVar16 = -((this->field_0).v128[5] == (local_20->field_0).v128[5]);
        cVar17 = -((this->field_0).v128[6] == (local_20->field_0).v128[6]);
        cVar18 = -((this->field_0).v128[7] == (local_20->field_0).v128[7]);
        cVar19 = -((this->field_0).v128[8] == (local_20->field_0).v128[8]);
        cVar20 = -((this->field_0).v128[9] == (local_20->field_0).v128[9]);
        cVar21 = -((this->field_0).v128[10] == (local_20->field_0).v128[10]);
        cVar22 = -((this->field_0).v128[0xb] == (local_20->field_0).v128[0xb]);
        cVar23 = -((this->field_0).v128[0xc] == (local_20->field_0).v128[0xc]);
        cVar24 = -((this->field_0).v128[0xd] == (local_20->field_0).v128[0xd]);
        cVar25 = -((this->field_0).v128[0xe] == (local_20->field_0).v128[0xe]);
        bVar26 = -((this->field_0).v128[0xf] == (local_20->field_0).v128[0xf]);
        auVar1[1] = cVar12;
        auVar1[0] = cVar11;
        auVar1[2] = cVar13;
        auVar1[3] = cVar14;
        auVar1[4] = cVar15;
        auVar1[5] = cVar16;
        auVar1[6] = cVar17;
        auVar1[7] = cVar18;
        auVar1[8] = cVar19;
        auVar1[9] = cVar20;
        auVar1[10] = cVar21;
        auVar1[0xb] = cVar22;
        auVar1[0xc] = cVar23;
        auVar1[0xd] = cVar24;
        auVar1[0xe] = cVar25;
        auVar1[0xf] = bVar26;
        auVar2[1] = cVar12;
        auVar2[0] = cVar11;
        auVar2[2] = cVar13;
        auVar2[3] = cVar14;
        auVar2[4] = cVar15;
        auVar2[5] = cVar16;
        auVar2[6] = cVar17;
        auVar2[7] = cVar18;
        auVar2[8] = cVar19;
        auVar2[9] = cVar20;
        auVar2[10] = cVar21;
        auVar2[0xb] = cVar22;
        auVar2[0xc] = cVar23;
        auVar2[0xd] = cVar24;
        auVar2[0xe] = cVar25;
        auVar2[0xf] = bVar26;
        auVar6[1] = cVar14;
        auVar6[0] = cVar13;
        auVar6[2] = cVar15;
        auVar6[3] = cVar16;
        auVar6[4] = cVar17;
        auVar6[5] = cVar18;
        auVar6[6] = cVar19;
        auVar6[7] = cVar20;
        auVar6[8] = cVar21;
        auVar6[9] = cVar22;
        auVar6[10] = cVar23;
        auVar6[0xb] = cVar24;
        auVar6[0xc] = cVar25;
        auVar6[0xd] = bVar26;
        auVar5[1] = cVar15;
        auVar5[0] = cVar14;
        auVar5[2] = cVar16;
        auVar5[3] = cVar17;
        auVar5[4] = cVar18;
        auVar5[5] = cVar19;
        auVar5[6] = cVar20;
        auVar5[7] = cVar21;
        auVar5[8] = cVar22;
        auVar5[9] = cVar23;
        auVar5[10] = cVar24;
        auVar5[0xb] = cVar25;
        auVar5[0xc] = bVar26;
        auVar4[1] = cVar16;
        auVar4[0] = cVar15;
        auVar4[2] = cVar17;
        auVar4[3] = cVar18;
        auVar4[4] = cVar19;
        auVar4[5] = cVar20;
        auVar4[6] = cVar21;
        auVar4[7] = cVar22;
        auVar4[8] = cVar23;
        auVar4[9] = cVar24;
        auVar4[10] = cVar25;
        auVar4[0xb] = bVar26;
        auVar3[1] = cVar17;
        auVar3[0] = cVar16;
        auVar3[2] = cVar18;
        auVar3[3] = cVar19;
        auVar3[4] = cVar20;
        auVar3[5] = cVar21;
        auVar3[6] = cVar22;
        auVar3[7] = cVar23;
        auVar3[8] = cVar24;
        auVar3[9] = cVar25;
        auVar3[10] = bVar26;
        this_local._7_1_ =
             (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(bVar26,CONCAT18(cVar25,CONCAT17(cVar24,CONCAT16(
                                                  cVar23,CONCAT15(cVar22,CONCAT14(cVar21,CONCAT13(
                                                  cVar20,CONCAT12(cVar19,CONCAT11(cVar18,cVar17)))))
                                                  )))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(bVar26,CONCAT17(cVar25,CONCAT16(cVar24,CONCAT15(
                                                  cVar23,CONCAT14(cVar22,CONCAT13(cVar21,CONCAT12(
                                                  cVar20,CONCAT11(cVar19,cVar18)))))))) >> 7) & 1)
                      << 7 | (ushort)(bVar26 >> 7) << 0xf) == 0xffff;
      }
    }
    else {
      bVar7 = wasm::Type::isRef(&this->type);
      if (!bVar7) goto switchD_01b8c3cc_default;
      bVar7 = wasm::Type::isRef(&this->type);
      if (!bVar7) {
        __assert_fail("type.isRef()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                      ,0x1ac,"bool wasm::Literal::operator==(const Literal &) const");
      }
      bVar7 = wasm::Type::isNull(&this->type);
      if (bVar7) {
        this_local._7_1_ = true;
      }
      else {
        bVar7 = wasm::Type::isFunction(&this->type);
        if (bVar7) {
          bVar7 = IString::is((IString *)this);
          local_41 = false;
          if (bVar7) {
            local_41 = IString::is((IString *)local_20);
          }
          if (local_41 == false) {
            __assert_fail("func.is() && other.func.is()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                          ,0x1b1,"bool wasm::Literal::operator==(const Literal &) const");
          }
          this_local._7_1_ = IString::operator==((IString *)this,(IString *)local_20);
        }
        else {
          bVar7 = wasm::Type::isString(&this->type);
          if (bVar7) {
            peVar9 = std::
                     __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
            peVar10 = std::
                      __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_20);
            this_local._7_1_ =
                 SmallVector<wasm::Literal,_1UL>::operator==
                           (&(peVar9->values).super_SmallVector<wasm::Literal,_1UL>,
                            &(peVar10->values).super_SmallVector<wasm::Literal,_1UL>);
          }
          else {
            bVar7 = wasm::Type::isData(&this->type);
            if (bVar7) {
              this_local._7_1_ =
                   std::operator==((shared_ptr<wasm::GCData> *)this,
                                   (shared_ptr<wasm::GCData> *)local_20);
            }
            else {
              local_28 = wasm::Type::getHeapType(&this->type);
              local_2c = i31;
              bVar7 = HeapType::operator==(&local_28,&local_2c);
              if (!bVar7) {
                handle_unreachable("unexpected type",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                                   ,0x1bd);
              }
              this_local._7_1_ = (this->field_0).i32 == (local_20->field_0).i32;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Literal::operator==(const Literal& other) const {
  if (type != other.type) {
    return false;
  }
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return true; // special voided literal
      case Type::i32:
      case Type::f32:
        return i32 == other.i32;
      case Type::i64:
      case Type::f64:
        return i64 == other.i64;
      case Type::v128:
        return memcmp(v128, other.v128, 16) == 0;
      case Type::unreachable:
        break;
    }
  } else if (type.isRef()) {
    assert(type.isRef());
    if (type.isNull()) {
      return true;
    }
    if (type.isFunction()) {
      assert(func.is() && other.func.is());
      return func == other.func;
    }
    if (type.isString()) {
      return gcData->values == other.gcData->values;
    }
    if (type.isData()) {
      return gcData == other.gcData;
    }
    if (type.getHeapType() == HeapType::i31) {
      return i32 == other.i32;
    }
    WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("unexpected type");
}